

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::ui_attach(Nvim *this,Integer width,Integer height,Dictionary *options)

{
  allocator local_49;
  string local_48;
  Dictionary *local_28;
  Dictionary *options_local;
  Integer height_local;
  Integer width_local;
  Nvim *this_local;
  
  local_28 = options;
  options_local = (Dictionary *)height;
  height_local = width;
  width_local = (Integer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nvim_ui_attach",&local_49);
  NvimRPC::
  call<long,long,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_48,(nullptr_t)0x0,&height_local,(long *)&options_local,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void Nvim::ui_attach(Integer width, Integer height, const Dictionary& options) {
    client_.call("nvim_ui_attach", nullptr, width, height, options);
}